

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O3

Component __thiscall
ftxui::Slider<int>(ftxui *this,ConstStringRef *label,int *value,int min,int max,int increment)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  undefined1 local_45;
  int increment_local;
  int max_local;
  int min_local;
  SliderBase<int> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  int *value_local;
  
  local_38 = (SliderBase<int> *)0x0;
  increment_local = increment;
  max_local = max;
  min_local = min;
  value_local = value;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ftxui::SliderBase<int>,std::allocator<ftxui::SliderBase<int>>,ftxui::ConstStringRef&,int*&,int&,int&,int&>
            (&_Stack_30,&local_38,(allocator<ftxui::SliderBase<int>_> *)&local_45,label,&value_local
             ,&min_local,&max_local,&increment_local);
  *(SliderBase<int> **)this = local_38;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Stack_30._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Slider(ConstStringRef label, T* value, T min, T max, T increment) {
  return Make<SliderBase<T>>(std::move(label), value, min, max, increment);
}